

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

result_type time_plain<trng::mrg3s>(mrg3s *r)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  string res;
  string local_40;
  double local_20;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  iVar2 = 0;
  lVar4 = 0x1000000;
  iVar7 = (r->S).r[0];
  iVar6 = (r->S).r[1];
  iVar5 = (r->S).r[2];
  do {
    iVar3 = iVar6;
    iVar6 = iVar7;
    uVar8 = (long)iVar5 * (long)(r->P).a[2] +
            (long)iVar3 * (long)(r->P).a[1] + (long)iVar6 * (long)(r->P).a[0];
    uVar8 = (uVar8 >> 0x1f) * -0x7fffadb3 + uVar8;
    uVar8 = (uVar8 >> 0x1f) * -0x7fffadb3 + uVar8;
    iVar5 = (int)uVar8;
    iVar7 = iVar5 + -0x7fffadb3;
    if (uVar8 < 0x7fffadb3) {
      iVar7 = iVar5;
    }
    iVar2 = iVar2 + iVar7;
    lVar4 = lVar4 + -1;
    iVar5 = iVar3;
  } while (lVar4 != 0);
  (r->S).r[0] = iVar7;
  (r->S).r[1] = iVar6;
  (r->S).r[2] = iVar3;
  lVar4 = std::chrono::_V2::system_clock::now();
  local_20 = 16.777216 / ((double)((lVar4 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_40,&local_20);
  while (local_40._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return iVar2;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}